

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LabelLengthCase::iterate(LabelLengthCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  undefined8 uVar7;
  NotSupportedError *this_00;
  allocator<char> local_295;
  int outlen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ScopedLogSection section;
  string local_228;
  code *local_208;
  int local_200;
  undefined1 local_1f8 [384];
  ResultCollector result;
  long lVar6;
  
  bVar3 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (bVar3) {
    iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar4);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f8," // ERROR: ",(allocator<char> *)&local_290);
    tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    outlen = -1;
    uVar7 = (**(code **)(lVar6 + 0x640))(0x9117,0);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"Got Error ",(allocator<char> *)&section);
      local_208 = glu::getErrorName;
      local_200 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_228,&local_208);
      std::operator+(&local_250,&local_270,&local_228);
      std::operator+(&local_290,&local_250,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"fenceSync");
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_270);
    }
    uVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"Got Error ",(allocator<char> *)&section);
      local_208 = glu::getErrorName;
      local_200 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_228,&local_208);
      std::operator+(&local_250,&local_270,&local_228);
      std::operator+(&local_290,&local_250,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"createShader");
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_270);
    }
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f8,"Shader",(allocator<char> *)&local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"Shader object",(allocator<char> *)&local_270);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_1f8,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)local_1f8);
    local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Querying label length");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    outlen = -1;
    (**(code **)(lVar6 + 0x958))(0x82e1,uVar5,0,&outlen,0);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"Got Error ",&local_295);
      local_208 = glu::getErrorName;
      local_200 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_228,&local_208);
      std::operator+(&local_250,&local_270,&local_228);
      std::operator+(&local_290,&local_250,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"getObjectLabel");
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_270);
    }
    if (outlen == 0) {
      local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1f8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Query returned length: ");
      std::ostream::operator<<(poVar1,outlen);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    else {
      de::toString<int>(&local_290,&outlen);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     "\'length\' was not 0, got ",&local_290);
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
    }
    local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Setting label to string: \"");
    std::operator<<((ostream *)poVar1,"This is a debug label");
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar6 + 0xfc0))(0x82e1,uVar5,0xffffffffffffffff,"This is a debug label");
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"Got Error ",&local_295);
      local_208 = glu::getErrorName;
      local_200 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_228,&local_208);
      std::operator+(&local_250,&local_270,&local_228);
      std::operator+(&local_290,&local_250,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"objectLabel");
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_270);
    }
    local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Querying label length");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    outlen = -1;
    (**(code **)(lVar6 + 0x958))(0x82e1,uVar5,0,&outlen,0);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"Got Error ",&local_295);
      local_208 = glu::getErrorName;
      local_200 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_228,&local_208);
      std::operator+(&local_250,&local_270,&local_228);
      std::operator+(&local_290,&local_250,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"getObjectLabel");
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_270);
    }
    if (outlen == 0x15) {
      local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1f8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Query returned length: ");
      std::ostream::operator<<(poVar1,outlen);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    else {
      de::toString<int>(&local_290,&outlen);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     "\'length\' was not 21, got ",&local_290);
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f8,"Sync",(allocator<char> *)&local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"Sync object",(allocator<char> *)&local_270);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_1f8,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)local_1f8);
    local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Querying label length");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    outlen = -1;
    (**(code **)(lVar6 + 0x960))(uVar7,0,&outlen,0);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"Got Error ",&local_295);
      local_208 = glu::getErrorName;
      local_200 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_228,&local_208);
      std::operator+(&local_250,&local_270,&local_228);
      std::operator+(&local_290,&local_250,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"getObjectPtrLabel");
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_270);
    }
    if (outlen == 0) {
      local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1f8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Query returned length: ");
      std::ostream::operator<<(poVar1,outlen);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    else {
      de::toString<int>(&local_290,&outlen);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     "\'length\' was not 0, got ",&local_290);
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
    }
    local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Setting label to string: \"");
    std::operator<<((ostream *)poVar1,"This is a debug label");
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar6 + 0xfc8))(uVar7,0xffffffffffffffff,"This is a debug label");
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"Got Error ",&local_295);
      local_208 = glu::getErrorName;
      local_200 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_228,&local_208);
      std::operator+(&local_250,&local_270,&local_228);
      std::operator+(&local_290,&local_250,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"objectPtrLabel");
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_270);
    }
    local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Querying label length");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    outlen = -1;
    (**(code **)(lVar6 + 0x960))(uVar7,0,&outlen,0);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"Got Error ",&local_295);
      local_208 = glu::getErrorName;
      local_200 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_228,&local_208);
      std::operator+(&local_250,&local_270,&local_228);
      std::operator+(&local_290,&local_250,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"getObjectPtrLabel");
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_270);
    }
    if (outlen == 0x15) {
      local_1f8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1f8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Query returned length: ");
      std::ostream::operator<<(poVar1,outlen);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    else {
      de::toString<int>(&local_290,&outlen);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     "\'length\' was not 21, got ",&local_290);
      tcu::ResultCollector::fail(&result,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    (**(code **)(lVar6 + 0x470))(uVar5);
    (**(code **)(lVar6 + 0x478))(uVar7);
    tcu::ResultCollector::setTestContextResult
              (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::ResultCollector::~ResultCollector(&result);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x9d8);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

LabelLengthCase::IterateResult LabelLengthCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 0)
			result.fail("'length' was not 0, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 21)
			result.fail("'length' was not 21, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectPtrLabel(sync, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 0)
			result.fail("'length' was not 0, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectPtrLabel(sync, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 21)
			result.fail("'length' was not 21, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}